

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_crushing_hand(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar4;
  
  iVar3 = 0xa0;
  pCVar4 = in_RCX;
  iVar2 = number_percent();
  iVar3 = iVar2 / 2 + iVar3;
  bVar1 = saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  if (bVar1) {
    iVar3 = iVar3 + -0x3c;
  }
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
      (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  iVar2 = number_percent();
  if (iVar2 < 0x3c) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RCX,
        (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    LAG_CHAR((CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  }
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,in_ESI),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)pCVar4 >> 0x20),SUB81((ulong)pCVar4 >> 0x18,0));
  return;
}

Assistant:

void spell_crushing_hand(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;
	dam = 160;

	dam += (number_percent()) / 2;

	if (saves_spell(level + 1, victim, DAM_OTHER))
		dam -= 60;

	act("$n creates a huge spectral hand to brutally pummel $N!", ch, 0, victim, TO_NOTVICT);
	act("$n creates a huge spectral hand to brutally pummel you!", ch, 0, victim, TO_VICT);
	act("You create a huge spectral hand to brutally pummel $N!", ch, 0, victim, TO_CHAR);

	if (number_percent() < 60)
	{
		act("$N appears to be stunned by the blow.", ch, 0, victim, TO_NOTVICT);
		act("You feel stunned by the brutal blow.", ch, 0, victim, TO_VICT);
		act("$N appears to be stunned by the blow.", ch, 0, victim, TO_CHAR);
		LAG_CHAR(victim, PULSE_VIOLENCE * 2);
	}

	damage_old(ch, victim, dam, sn, DAM_BASH, true);
}